

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O1

string * __thiscall
(anonymous_namespace)::BuildFileImpl::stringFromScalarNode_abi_cxx11_
          (string *__return_storage_ptr__,void *this,ScalarNode *scalar)

{
  char *pcVar1;
  StringRef SVar2;
  SmallString<256U> storage;
  SmallVectorImpl<char> local_120;
  undefined1 local_110 [256];
  
  local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x100;
  local_120.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_110;
  SVar2 = llvm::yaml::ScalarNode::getValue((ScalarNode *)this,&local_120);
  pcVar1 = SVar2.Data;
  if (pcVar1 == (char *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + SVar2.Length);
  }
  if ((undefined1 *)
      local_120.super_SmallVectorTemplateBase<char,_true>.
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX != local_110) {
    free(local_120.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string stringFromScalarNode(llvm::yaml::ScalarNode* scalar) {
    SmallString<256> storage;
    return scalar->getValue(storage).str();
  }